

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O3

void duckdb::AggregateExecutor::
     UnaryUpdate<duckdb::ApproxQuantileState,short,duckdb::ApproxQuantileListOperation<short>>
               (Vector *input,AggregateInputData *aggr_input_data,data_ptr_t state,idx_t count)

{
  long lVar1;
  short *input_00;
  long lVar2;
  ulong uVar3;
  FunctionData *pFVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  AggregateUnaryInput input_data;
  undefined1 local_98 [32];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_78;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_58;
  Vector *local_50;
  AggregateUnaryInput local_48;
  
  if (*input == (Vector)0x0) {
    lVar2 = *(long *)(input + 0x20);
    FlatVector::VerifyFlatVector(input);
    local_98._8_8_ = input + 0x28;
    local_98._16_8_ = 0;
    if (0x3f < count + 0x3f) {
      uVar12 = 0;
      uVar11 = 0;
      uVar10 = 0;
      local_98._0_8_ = aggr_input_data;
      local_50 = (Vector *)local_98._8_8_;
      do {
        if (*(long *)local_50 == 0) {
          uVar13 = uVar10 + 0x40;
          if (count <= uVar10 + 0x40) {
            uVar13 = count;
          }
joined_r0x0054d3c8:
          while (uVar9 = uVar12, uVar6 = uVar12, uVar7 = local_98._16_8_, uVar12 < uVar13) {
            ApproxQuantileOperation::
            Operation<short,duckdb::ApproxQuantileState,duckdb::ApproxQuantileListOperation<short>>
                      ((ApproxQuantileState *)state,(short *)(uVar12 * 2 + lVar2),
                       (AggregateUnaryInput *)local_98);
            uVar12 = local_98._16_8_ + 1;
            local_98._16_8_ = uVar12;
          }
        }
        else {
          uVar3 = *(ulong *)(*(long *)local_50 + uVar11 * 8);
          uVar13 = uVar10 + 0x40;
          if (count <= uVar10 + 0x40) {
            uVar13 = count;
          }
          if (uVar3 == 0xffffffffffffffff) goto joined_r0x0054d3c8;
          uVar9 = uVar13;
          uVar6 = uVar13;
          uVar7 = uVar13;
          uVar8 = uVar10;
          uVar5 = local_98._16_8_;
          if (uVar3 != 0) {
            while (local_98._16_8_ = uVar8, uVar9 = local_98._16_8_, uVar6 = uVar12, uVar7 = uVar5,
                  (ulong)local_98._16_8_ < uVar13) {
              if ((uVar3 >> ((ulong)(uint)((int)local_98._16_8_ - (int)uVar10) & 0x3f) & 1) != 0) {
                lVar1 = local_98._16_8_ * 2;
                local_98._16_8_ = uVar5;
                ApproxQuantileOperation::
                Operation<short,duckdb::ApproxQuantileState,duckdb::ApproxQuantileListOperation<short>>
                          ((ApproxQuantileState *)state,(short *)(lVar1 + lVar2),
                           (AggregateUnaryInput *)local_98);
              }
              uVar12 = local_98._16_8_ + 1;
              uVar5 = uVar12;
              uVar8 = uVar12;
            }
          }
        }
        local_98._16_8_ = uVar7;
        uVar12 = uVar6;
        uVar11 = uVar11 + 1;
        uVar10 = uVar9;
      } while (uVar11 != count + 0x3f >> 6);
    }
  }
  else if (*input == (Vector)0x2) {
    if ((*(byte **)(input + 0x28) == (byte *)0x0) || ((**(byte **)(input + 0x28) & 1) != 0)) {
      input_00 = *(short **)(input + 0x20);
      local_98._8_8_ = input + 0x28;
      local_98._16_8_ = 0;
      if (count != 0) {
        local_98._0_8_ = aggr_input_data;
        do {
          ApproxQuantileOperation::
          Operation<short,duckdb::ApproxQuantileState,duckdb::ApproxQuantileListOperation<short>>
                    ((ApproxQuantileState *)state,input_00,(AggregateUnaryInput *)local_98);
          count = count - 1;
        } while (count != 0);
      }
    }
  }
  else {
    duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_98);
    duckdb::Vector::ToUnifiedFormat((ulong)input,(UnifiedVectorFormat *)count);
    local_48.input_mask = (ValidityMask *)(local_98 + 0x10);
    local_48.input = aggr_input_data;
    if (local_98._16_8_ == 0) {
      if (count != 0) {
        pFVar4 = ((optional_ptr<duckdb::FunctionData,_true> *)local_98._0_8_)->ptr;
        uVar12 = 0;
        do {
          local_48.input_idx = uVar12;
          if (pFVar4 != (FunctionData *)0x0) {
            local_48.input_idx = (idx_t)*(uint *)(pFVar4 + uVar12 * 4);
          }
          ApproxQuantileOperation::
          Operation<short,duckdb::ApproxQuantileState,duckdb::ApproxQuantileListOperation<short>>
                    ((ApproxQuantileState *)state,
                     (short *)((long)&((TemplatedValidityMask<unsigned_long> *)local_98._8_8_)->
                                      validity_mask + local_48.input_idx * 2),&local_48);
          uVar12 = uVar12 + 1;
        } while (count != uVar12);
      }
    }
    else if (count != 0) {
      pFVar4 = ((optional_ptr<duckdb::FunctionData,_true> *)local_98._0_8_)->ptr;
      uVar12 = 0;
      do {
        local_48.input_idx = uVar12;
        if (pFVar4 != (FunctionData *)0x0) {
          local_48.input_idx = (idx_t)*(uint *)(pFVar4 + uVar12 * 4);
        }
        if ((local_98._16_8_ == 0) ||
           ((*(ulong *)(local_98._16_8_ + (local_48.input_idx >> 6) * 8) >>
             (local_48.input_idx & 0x3f) & 1) != 0)) {
          ApproxQuantileOperation::
          Operation<short,duckdb::ApproxQuantileState,duckdb::ApproxQuantileListOperation<short>>
                    ((ApproxQuantileState *)state,
                     (short *)((long)&((TemplatedValidityMask<unsigned_long> *)local_98._8_8_)->
                                      validity_mask + local_48.input_idx * 2),&local_48);
        }
        uVar12 = uVar12 + 1;
      } while (count != uVar12);
    }
    if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58);
    }
    if (local_78 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_78);
    }
  }
  return;
}

Assistant:

static void UnaryUpdate(Vector &input, AggregateInputData &aggr_input_data, data_ptr_t state, idx_t count) {
		switch (input.GetVectorType()) {
		case VectorType::CONSTANT_VECTOR: {
			if (OP::IgnoreNull() && ConstantVector::IsNull(input)) {
				return;
			}
			auto idata = ConstantVector::GetData<INPUT_TYPE>(input);
			AggregateUnaryInput input_data(aggr_input_data, ConstantVector::Validity(input));
			OP::template ConstantOperation<INPUT_TYPE, STATE_TYPE, OP>(*reinterpret_cast<STATE_TYPE *>(state), *idata,
			                                                           input_data, count);
			break;
		}
#ifndef DUCKDB_SMALLER_BINARY
		case VectorType::FLAT_VECTOR: {
			auto idata = FlatVector::GetData<INPUT_TYPE>(input);
			UnaryFlatUpdateLoop<STATE_TYPE, INPUT_TYPE, OP>(idata, aggr_input_data, (STATE_TYPE *)state, count,
			                                                FlatVector::Validity(input));
			break;
		}
#endif
		default: {
			UnifiedVectorFormat idata;
			input.ToUnifiedFormat(count, idata);
			UnaryUpdateLoop<STATE_TYPE, INPUT_TYPE, OP>(UnifiedVectorFormat::GetData<INPUT_TYPE>(idata),
			                                            aggr_input_data, (STATE_TYPE *)state, count, idata.validity,
			                                            *idata.sel);
			break;
		}
		}
	}